

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::state::clear(state *this)

{
  undefined4 *in_RDI;
  uint i;
  uint local_c;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[8] = 0;
  for (local_c = 0; local_c < 2; local_c = local_c + 1) {
    lzham::quasi_adaptive_huffman_data_model::clear();
    lzham::quasi_adaptive_huffman_data_model::clear();
  }
  lzham::quasi_adaptive_huffman_data_model::clear();
  lzham::quasi_adaptive_huffman_data_model::clear();
  lzham::quasi_adaptive_huffman_data_model::clear();
  lzham::quasi_adaptive_huffman_data_model::clear();
  in_RDI[2] = 1;
  in_RDI[3] = 1;
  in_RDI[4] = 1;
  in_RDI[5] = 1;
  return;
}

Assistant:

void lzcompressor::state::clear()
   {
      m_cur_ofs = 0;
      m_cur_state = 0;
      m_block_start_dict_ofs = 0;

      for (uint i = 0; i < 2; i++)
      {
         m_rep_len_table[i].clear();
         m_large_len_table[i].clear();
      }
      m_main_table.clear();
      m_dist_lsb_table.clear();

		m_lit_table.clear();
      m_delta_lit_table.clear();

      m_match_hist[0] = 1;
      m_match_hist[1] = 1;
      m_match_hist[2] = 1;
      m_match_hist[3] = 1;
   }